

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent,SourceCodeInfo *source_code_info)

{
  SourceCodeInfo_Location *pSVar1;
  RepeatedField<int> *other;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int32 value;
  RepeatedField<int> *in_stack_ffffffffffffffd0;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RDX;
  pSVar1 = SourceCodeInfo::add_location((SourceCodeInfo *)0x6077ea);
  in_RDI[2] = pSVar1;
  other = SourceCodeInfo_Location::mutable_path((SourceCodeInfo_Location *)0x6077ff);
  SourceCodeInfo_Location::path((SourceCodeInfo_Location *)0x607811);
  RepeatedField<int>::CopyFrom(in_stack_ffffffffffffffd0,other);
  value = (int32)((ulong)other >> 0x20);
  pSVar1 = (SourceCodeInfo_Location *)in_RDI[2];
  io::Tokenizer::current(*(Tokenizer **)*in_RDI);
  SourceCodeInfo_Location::add_span(pSVar1,value);
  io::Tokenizer::current(*(Tokenizer **)*in_RDI);
  SourceCodeInfo_Location::add_span(pSVar1,value);
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent,
                                    SourceCodeInfo* source_code_info) {
  parser_ = parent.parser_;
  source_code_info_ = source_code_info;

  location_ = source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}